

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O3

bool __thiscall
IR::Instr::IterateArgInstrs<Inline::Optimize(Func*,IR::Instr**,unsigned_short,unsigned_int)::__0>
          (Instr *this,anon_class_8_1_406103b2 callback)

{
  OpCode OVar1;
  Opnd *pOVar2;
  _func_int **pp_Var3;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  byte bVar7;
  ArgSlot AVar8;
  uint uVar9;
  StackSym *pSVar10;
  undefined4 *puVar11;
  anon_class_8_1_406103b2 aVar12;
  uint uVar13;
  Instr *pIVar14;
  Instr *pIVar15;
  
  pSVar10 = Opnd::GetStackSym(this->m_src2);
  pIVar14 = (pSVar10->field_5).m_instrDef;
  if ((pIVar14 != (Instr *)0x0 & pSVar10->field_0x18) == 1) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar6) {
LAB_00542261:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
    pIVar14 = (pSVar10->field_5).m_instrDef;
  }
  do {
    if ((pIVar14->m_src2 == (Opnd *)0x0) ||
       (OVar5 = Opnd::GetKind(pIVar14->m_src2), OVar5 != OpndKindSym)) {
LAB_00541fc2:
      pIVar15 = (Instr *)0x0;
    }
    else {
      pOVar2 = pIVar14->m_src2;
      OVar5 = Opnd::GetKind(pOVar2);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar6) goto LAB_00542261;
        *puVar11 = 0;
      }
      pp_Var3 = pOVar2[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar6) goto LAB_00542261;
        *puVar11 = 0;
      }
      uVar9 = *(uint *)(pp_Var3 + 3);
      uVar13 = uVar9 & 0x100000;
      if ((uVar13 != 0) && (*(short *)((long)pp_Var3 + 0x16) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar6) goto LAB_00542261;
        *puVar11 = 0;
        uVar9 = *(uint *)(pp_Var3 + 3);
        uVar13 = uVar9 & 0x100000;
      }
      if (uVar13 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar6) goto LAB_00542261;
        *puVar11 = 0;
        uVar9 = *(uint *)(pp_Var3 + 3);
      }
      if (((((uVar9 & 1) == 0) || (pp_Var3[5] == (_func_int *)0x0)) &&
          (bVar6 = Func::IsInPhase(this->m_func,FGPeepsPhase), !bVar6)) &&
         (bVar6 = Func::IsInPhase(this->m_func,FGBuildPhase), !bVar6)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar6) goto LAB_00542261;
        *puVar11 = 0;
      }
      if (((ulong)pp_Var3[3] & 1) == 0) goto LAB_00541fc2;
      pIVar15 = (Instr *)pp_Var3[5];
    }
    OVar1 = pIVar14->m_opcode;
    aVar12.constantArguments = (uint16 *)(ulong)OVar1;
    if (OVar1 != ArgOut_A_InlineSpecialized) {
      if (OVar1 == StartCall) {
        if (pIVar15 == (Instr *)0x0) {
          return (bool)(char)OVar1;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
        if (bVar6) {
          *puVar11 = 0;
          return bVar6;
        }
        goto LAB_00542261;
      }
      pOVar2 = pIVar14->m_src1;
      OVar5 = Opnd::GetKind(pOVar2);
      aVar12.constantArguments = (uint16 *)(ulong)OVar5;
      if (OVar5 == OpndKindReg) {
        OVar5 = Opnd::GetKind(pOVar2);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar6) goto LAB_00542261;
          *puVar11 = 0;
        }
        bVar6 = StackSym::IsIntConst((StackSym *)pOVar2[1]._vptr_Opnd);
        aVar12.constantArguments = (uint16 *)(ulong)bVar6;
        if ((bVar6) && (pIVar14->m_src2 != (Opnd *)0x0)) {
          OVar5 = Opnd::GetKind(pIVar14->m_src2);
          aVar12.constantArguments = (uint16 *)(ulong)OVar5;
          if (OVar5 == OpndKindSym) {
            pOVar2 = pIVar14->m_dst;
            OVar5 = Opnd::GetKind(pOVar2);
            if (OVar5 != OpndKindSym) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
              if (!bVar6) goto LAB_00542261;
              *puVar11 = 0;
            }
            pSVar10 = (StackSym *)pOVar2[1]._vptr_Opnd;
            if ((pSVar10->super_Sym).m_kind != SymKindStack) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                 ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
              if (!bVar6) goto LAB_00542261;
              *puVar11 = 0;
            }
            uVar9 = *(uint *)&pSVar10->field_0x18;
            if (((uVar9 & 1) == 0) || ((pSVar10->field_5).m_instrDef == (Instr *)0x0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x174,"(dstSym->IsSingleDef())","dstSym->IsSingleDef()");
              if (!bVar6) goto LAB_00542261;
              *puVar11 = 0;
              uVar9 = *(uint *)&pSVar10->field_0x18;
            }
            uVar9 = uVar9 & 0x100000;
            if ((uVar9 != 0) && (*(short *)&(pSVar10->super_Sym).field_0x16 == 0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                 ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
              if (!bVar6) goto LAB_00542261;
              *puVar11 = 0;
              uVar9 = *(uint *)&pSVar10->field_0x18 & 0x100000;
            }
            if (uVar9 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x175,"(dstSym->IsArgSlotSym())","dstSym->IsArgSlotSym()");
              if (!bVar6) goto LAB_00542261;
              *puVar11 = 0;
            }
            AVar8 = StackSym::GetArgSlotNum(pSVar10);
            bVar7 = (byte)(AVar8 - 1);
            if ((ArgSlot)(AVar8 - 1) == 0xd) {
              return (bool)bVar7;
            }
            *callback.constantArguments =
                 *callback.constantArguments | (ushort)(1 << (bVar7 & 0x1f));
            aVar12.constantArguments = callback.constantArguments;
          }
        }
      }
    }
    pIVar14 = pIVar15;
    if (pIVar15 == (Instr *)0x0) {
      return (bool)(char)aVar12.constantArguments;
    }
  } while( true );
}

Assistant:

bool IterateArgInstrs(Fn callback)
    {
        StackSym* linkSym = this->GetSrc2()->GetStackSym();
        Assert(linkSym->IsSingleDef());
        IR::Instr *argInstr = linkSym->m_instrDef;
        IR::Instr* nextArg = nullptr;
        do
        {
            // Get the next instr before calling 'callback' since callback might modify the IR.
            if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
            {
                linkSym = argInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
                Assert(linkSym->IsArgSlotSym());

                // Due to dead code elimination in FGPeeps, it is possible for the definitions of the
                // the instructions that we are visiting during FG to have been freed. In this case,
                // the ArgSlot, even though its was a single def, will report IsSingleDef() as false
                // since instrDef is reset to nullptr when the def instr is freed
                Assert(linkSym->IsSingleDef() ||
                    (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)));
                nextArg = linkSym->GetInstrDef();
            }
            else
            {
                nextArg = nullptr;
            }
            if(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)
            {
                argInstr = nextArg;
                // This is a fake ArgOut, skip it
                continue;
            }
            if (argInstr->m_opcode == Js::OpCode::StartCall)
            {
                Assert(nextArg == nullptr);
                break;
            }

            if(callback(argInstr))
            {
                return true;
            }
            argInstr = nextArg;
        } while(argInstr && !argInstr->IsInvalidInstr());

        // If an instr in the call sequence is invalid (0xFDFDFDFD), it must have been freed.
        // This is possible if some dead-code-removal/peeps code removed only part of the call sequence, while the whole sequence was dead (TH Bug 594245).
        // We allow this possibility here, while relying on the more involved dead-code-removal to remove the rest of the call sequence.
        // Inserting the opcode InvalidOpCode, with no lowering, here to safeguard against the possibility of a dead part of the call sequence not being removed. The lowerer would assert then.
        if (argInstr && argInstr->IsInvalidInstr())
        {
            this->InsertBefore(Instr::New(Js::OpCode::InvalidOpCode, this->m_func));
        }
        return false;
    }